

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

QAbstractItemDelegate * __thiscall
QAbstractItemView::itemDelegateForRow(QAbstractItemView *this,int row)

{
  QAbstractItemDelegate *pQVar1;
  long in_FS_OFFSET;
  QMap<int,_QPointer<QAbstractItemDelegate>_> local_28;
  QAbstractItemDelegate *local_20;
  int local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = row;
  QMap<int,_QPointer<QAbstractItemDelegate>_>::value
            (&local_28,(int *)(*(long *)(this + 8) + 0x310),
             (QPointer<QAbstractItemDelegate> *)&local_14);
  if ((local_28.d.d.ptr ==
       (totally_ordered_wrapper<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_*>
        )0x0) || (pQVar1 = local_20, *(int *)((long)local_28.d.d.ptr + 4) == 0)) {
    pQVar1 = (QAbstractItemDelegate *)0x0;
  }
  if (local_28.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_28.d.d.ptr = *(int *)local_28.d.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_28.d.d.ptr == 0) &&
       (local_28.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<int,_QPointer<QAbstractItemDelegate>,_std::less<int>,_std::allocator<std::pair<const_int,_QPointer<QAbstractItemDelegate>_>_>_>_>_*>
         )0x0)) {
      operator_delete((void *)local_28.d.d.ptr);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemDelegate *QAbstractItemView::itemDelegateForRow(int row) const
{
    Q_D(const QAbstractItemView);
    return d->rowDelegates.value(row, nullptr);
}